

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O1

void __thiscall FParser::OPmultiply(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  svalue_t right;
  svalue_t left;
  svalue_t local_60;
  svalue_t local_48;
  
  local_48.string.Chars = FString::NullString.Nothing;
  local_48.type = 1;
  local_48.value.i = 0;
  local_60.string.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_60.type = 1;
  local_60.value.i = 0;
  EvaluateExpression(this,&local_48,start,n + -1);
  EvaluateExpression(this,&local_60,n + 1,stop);
  if ((local_48.type == 6) || (local_60.type == 6)) {
    dVar3 = floatvalue(&local_48);
    dVar4 = floatvalue(&local_60);
    (result->value).i = (int)(dVar3 * dVar4 * 65536.0);
    result->type = 6;
  }
  else {
    result->type = 1;
    iVar1 = intvalue(&local_48);
    iVar2 = intvalue(&local_60);
    (result->value).i = iVar2 * iVar1;
  }
  FString::~FString(&local_60.string);
  FString::~FString(&local_48.string);
  return;
}

Assistant:

void FParser::OPmultiply(svalue_t &result,int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	// haleyjd: 8-17
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.setDouble(floatvalue(left) * floatvalue(right));
	}
	else
	{
		result.type = svt_int;
		result.value.i = intvalue(left) * intvalue(right);
	}
}